

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O2

int Abc_NtkEliminate1(Abc_Ntk_t *pNtk,int ElimValue,int nMaxSize,int nIterMax,int fReverse,
                     int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  if (0 < nIterMax) {
    iVar3 = nIterMax;
  }
  iVar3 = iVar3 + 1;
  while( true ) {
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) {
      return 1;
    }
    iVar1 = pNtk->nObjCounts[7];
    iVar2 = Abc_NtkEliminate1One(pNtk,ElimValue,nMaxSize,fReverse,fVerbose);
    if (iVar2 == 0) break;
    if (iVar1 == pNtk->nObjCounts[7]) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int Abc_NtkEliminate1( Abc_Ntk_t * pNtk, int ElimValue, int nMaxSize, int nIterMax, int fReverse, int fVerbose )
{
    int i;
    for ( i = 0; i < nIterMax; i++ )
    {
        int nNodes = Abc_NtkNodeNum(pNtk);
//        printf( "%d ", nNodes );
        if ( !Abc_NtkEliminate1One(pNtk, ElimValue, nMaxSize, fReverse, fVerbose) )
            return 0;
        if ( nNodes == Abc_NtkNodeNum(pNtk) )
            break;
    }
    return 1;
}